

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalysis.cpp
# Opt level: O3

void __thiscall
TPZAnalysis::TPZAnalysis
          (TPZAnalysis *this,void **vtt,TPZCompMesh *mesh,bool mustOptimizeBandwidth,ostream *out)

{
  undefined8 *puVar1;
  ESolType EVar2;
  long lVar3;
  TPZReference *pTVar4;
  TPZSloanRenumbering *this_00;
  TPZReference *pTVar5;
  TPZReference *pTVar6;
  
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)vtt[1];
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)*vtt;
  this->fGeoMesh = (TPZGeoMesh *)0x0;
  this->fCompMesh = (TPZCompMesh *)0x0;
  EVar2 = mesh->fSolType;
  this->fSolType = EVar2;
  this->fGraphMesh[0] = (TPZGraphMesh *)0x0;
  this->fGraphMesh[1] = (TPZGraphMesh *)0x0;
  this->fGraphMesh[2] = (TPZGraphMesh *)0x0;
  TPZSolutionMatrix::TPZSolutionMatrix(&this->fSolution,EVar2 == EComplex);
  this->fSolver = (TPZSolver *)0x0;
  lVar3 = 0x180;
  do {
    *(undefined ***)((long)this->fGraphMesh + lVar3 + -0x28) = &PTR__TPZVec_0181b468;
    puVar1 = (undefined8 *)((long)this->fGraphMesh + lVar3 + -0x20);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)this->fGraphMesh + lVar3 + -0x10) = 0;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x1e0);
  lVar3 = 0x1e0;
  do {
    *(undefined ***)((long)this->fGraphMesh + lVar3 + -0x28) = &PTR__TPZVec_0181b468;
    puVar1 = (undefined8 *)((long)this->fGraphMesh + lVar3 + -0x20);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)this->fGraphMesh + lVar3 + -0x10) = 0;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x240);
  lVar3 = 0x240;
  do {
    *(undefined ***)((long)this->fGraphMesh + lVar3 + -0x28) = &PTR__TPZVec_0181b468;
    puVar1 = (undefined8 *)((long)this->fGraphMesh + lVar3 + -0x20);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)this->fGraphMesh + lVar3 + -0x10) = 0;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x2a0);
  this->fStep = 0;
  this->fNthreadsError = 0;
  pTVar4 = (TPZReference *)operator_new(0x10);
  (pTVar4->fCounter).super___atomic_base<int>._M_i = 0;
  pTVar4->fPointer = (TPZStructMatrix *)0x0;
  LOCK();
  (pTVar4->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  (this->fStructMatrix).fRef = pTVar4;
  this_00 = (TPZSloanRenumbering *)operator_new(0xd0);
  TPZSloanRenumbering::TPZSloanRenumbering(this_00);
  (this->fRenumber).fRef = (TPZReference *)0x0;
  pTVar5 = (TPZReference *)operator_new(0x10);
  (pTVar5->fCounter).super___atomic_base<int>._M_i = 0;
  pTVar5->fPointer = (TPZRenumbering *)this_00;
  LOCK();
  (pTVar5->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  (this->fRenumber).fRef = pTVar5;
  pTVar6 = (TPZReference *)operator_new(0x10);
  (pTVar6->fCounter).super___atomic_base<int>._M_i = 0;
  pTVar6->fPointer = (TPZGuiInterface *)0x0;
  LOCK();
  (pTVar6->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  (this->fGuiInterface).fRef = pTVar6;
  (this->fTable).super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TTablePostProcess_01966028;
  (this->fTable).fGeoElId._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
  (this->fTable).fGeoElId.fStore = (long *)0x0;
  (this->fTable).fGeoElId.fNElements = 0;
  (this->fTable).fGeoElId.fNAlloc = 0;
  (this->fTable).fCompElPtr._vptr_TPZVec = (_func_int **)&PTR__TPZVec_018141f0;
  (this->fTable).fCompElPtr.fStore = (TPZCompEl **)0x0;
  (this->fTable).fCompElPtr.fNElements = 0;
  (this->fTable).fCompElPtr.fNAlloc = 0;
  (this->fTable).fDimension = -1;
  (this->fTable).fLocations._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  (this->fTable).fLocations.fStore = (double *)0x0;
  (this->fTable).fLocations.fNElements = 0;
  (this->fTable).fLocations.fNAlloc = 0;
  (this->fTable).fVariableNames._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181b468;
  (this->fTable).fVariableNames.fStore =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (this->fTable).fVariableNames.fNElements = 0;
  (this->fTable).fVariableNames.fNAlloc = 0;
  SetCompMeshInit(this,mesh,mustOptimizeBandwidth);
  return;
}

Assistant:

TPZAnalysis::TPZAnalysis(TPZCompMesh *mesh, bool mustOptimizeBandwidth, std::ostream &out) :
TPZRegisterClassId(&TPZAnalysis::ClassId),
fSolType(mesh->GetSolType()),
// fRhs(fSolType == EComplex ? true : false),
fSolution(fSolType == EComplex ? true : false),
fRenumber(new RENUMBER)
{
  //we must not call virtual methods in constructor
  this->SetCompMeshInit(mesh, mustOptimizeBandwidth);
}